

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O0

ASN1_STRING * ASN1_STRING_set_by_NID(ASN1_STRING **out,uchar *in,int inlen,int inform,int nid)

{
  ASN1_STRING_TABLE *pAVar1;
  undefined4 in_register_00000014;
  ulong local_50;
  unsigned_long mask;
  ASN1_STRING_TABLE *tbl;
  uchar auStack_38 [4];
  int ret;
  ASN1_STRING *str;
  int nid_local;
  int inform_local;
  ossl_ssize_t len_local;
  uchar *in_local;
  ASN1_STRING **out_local;
  
  _nid_local = CONCAT44(in_register_00000014,inlen);
  _auStack_38 = 0;
  in_local = (uchar *)out;
  if (out == (ASN1_STRING **)0x0) {
    in_local = auStack_38;
  }
  str._0_4_ = nid;
  str._4_4_ = inform;
  len_local = (ossl_ssize_t)in;
  pAVar1 = asn1_string_table_get(nid);
  if (pAVar1 == (ASN1_STRING_TABLE *)0x0) {
    tbl._4_4_ = ASN1_mbstring_copy((ASN1_STRING **)in_local,(uchar *)len_local,(int)_nid_local,
                                   str._4_4_,0x2000);
  }
  else {
    local_50 = pAVar1->mask;
    if ((pAVar1->flags & 2) == 0) {
      local_50 = local_50 & 0x2000;
    }
    tbl._4_4_ = ASN1_mbstring_ncopy((ASN1_STRING **)in_local,(uchar *)len_local,(int)_nid_local,
                                    str._4_4_,local_50,pAVar1->minsize,pAVar1->maxsize);
  }
  if (tbl._4_4_ < 1) {
    out_local = (ASN1_STRING **)0x0;
  }
  else {
    out_local = *(ASN1_STRING ***)in_local;
  }
  return (ASN1_STRING *)out_local;
}

Assistant:

ASN1_STRING *ASN1_STRING_set_by_NID(ASN1_STRING **out, const unsigned char *in,
                                    ossl_ssize_t len, int inform, int nid) {
  ASN1_STRING *str = NULL;
  int ret;
  if (!out) {
    out = &str;
  }
  const ASN1_STRING_TABLE *tbl = asn1_string_table_get(nid);
  if (tbl != NULL) {
    unsigned long mask = tbl->mask;
    if (!(tbl->flags & STABLE_NO_MASK)) {
      mask &= B_ASN1_UTF8STRING;
    }
    ret = ASN1_mbstring_ncopy(out, in, len, inform, mask, tbl->minsize,
                              tbl->maxsize);
  } else {
    ret = ASN1_mbstring_copy(out, in, len, inform, B_ASN1_UTF8STRING);
  }
  if (ret <= 0) {
    return NULL;
  }
  return *out;
}